

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

bool __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::ExamineIfOptionIsSet
          (OptionInterpreter *this,const_iterator intermediate_fields_iter,
          const_iterator intermediate_fields_end,FieldDescriptor *innermost_field,
          string *debug_msg_name,UnknownFieldSet *unknown_fields)

{
  int value;
  undefined8 *puVar1;
  bool bVar2;
  long *plVar3;
  LogMessage *pLVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  _Alloc_hider _Var9;
  pointer pUVar10;
  long lVar11;
  UnknownFieldSet intermediate_unknown_fields;
  undefined1 local_98 [56];
  const_iterator local_60;
  const_iterator local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pUVar10 = (unknown_fields->fields_).
            super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
            ._M_impl.super__Vector_impl_data._M_start;
  uVar8 = (uint)((ulong)((long)(unknown_fields->fields_).
                               super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar10) >> 4);
  local_58._M_current = intermediate_fields_end._M_current;
  if (intermediate_fields_iter._M_current == intermediate_fields_end._M_current) {
    if (0 < (int)uVar8) {
      uVar6 = 0;
      while (pUVar10->number_ != *(uint32 *)(innermost_field + 0x44)) {
        uVar6 = uVar6 + 1;
        pUVar10 = pUVar10 + 1;
        if ((uVar8 & 0x7fffffff) == uVar6) {
          return (uVar8 & 0x7fffffff) <= uVar6;
        }
      }
      std::operator+(&local_50,"Option \"",debug_msg_name);
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_50);
      paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(plVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar3 == paVar5) {
        local_98._16_8_ = paVar5->_M_allocated_capacity;
        local_98._24_8_ = plVar3[3];
        local_98._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_98 + 0x10);
      }
      else {
        local_98._16_8_ = paVar5->_M_allocated_capacity;
        local_98._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*plVar3;
      }
      local_98._8_8_ = plVar3[1];
      *plVar3 = (long)paVar5;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      AddError(this->builder_,&this->options_to_interpret_->element_name,
               &this->uninterpreted_option_->super_Message,OPTION_NAME,(string *)local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_98 + 0x10)) {
        operator_delete((void *)local_98._0_8_);
      }
      _Var9._M_p = local_50._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
LAB_002dcfd1:
        operator_delete(_Var9._M_p);
      }
      return false;
    }
  }
  else {
    if ((int)uVar8 < 1) {
      return true;
    }
    local_60._M_current = intermediate_fields_iter._M_current + 1;
    lVar11 = 8;
    lVar7 = 0;
    do {
      paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*intermediate_fields_iter._M_current;
      if (*(int *)((long)pUVar10 + lVar11 + -8) == *(int *)(paVar5->_M_local_buf + 0x44)) {
        if (*(once_flag **)(paVar5->_M_local_buf + 0x30) != (once_flag *)0x0) {
          local_98._0_8_ = FieldDescriptor::TypeOnceInit;
          local_50._M_dataplus._M_p = (pointer)paVar5;
          std::
          call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                    (*(once_flag **)(paVar5->_M_local_buf + 0x30),
                     (_func_void_FieldDescriptor_ptr **)local_98,(FieldDescriptor **)&local_50);
        }
        value = *(int *)(paVar5->_M_local_buf + 0x38);
        if (value == 10) {
          if ((*(int *)((long)pUVar10 + lVar11 + -4) == 4) &&
             (bVar2 = ExamineIfOptionIsSet
                                (this,local_60,local_58,innermost_field,debug_msg_name,
                                 *(UnknownFieldSet **)((long)&pUVar10->number_ + lVar11)), !bVar2))
          {
            return false;
          }
        }
        else {
          if (value != 0xb) {
            internal::LogMessage::LogMessage
                      ((LogMessage *)local_98,LOGLEVEL_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/descriptor.cc"
                       ,0x1a2f);
            pLVar4 = internal::LogMessage::operator<<
                               ((LogMessage *)local_98,"Invalid wire type for CPPTYPE_MESSAGE: ");
            pLVar4 = internal::LogMessage::operator<<(pLVar4,value);
            internal::LogFinisher::operator=((LogFinisher *)&local_50,pLVar4);
            internal::LogMessage::~LogMessage((LogMessage *)local_98);
            return false;
          }
          if (*(int *)((long)pUVar10 + lVar11 + -4) == 3) {
            local_98._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
            local_98._8_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
            local_98._16_8_ = (pointer)0x0;
            puVar1 = *(undefined8 **)((long)&pUVar10->number_ + lVar11);
            bVar2 = UnknownFieldSet::ParseFromArray
                              ((UnknownFieldSet *)local_98,(void *)*puVar1,*(int *)(puVar1 + 1));
            if ((bVar2) &&
               (bVar2 = ExamineIfOptionIsSet
                                  (this,local_60,local_58,innermost_field,debug_msg_name,
                                   (UnknownFieldSet *)local_98), !bVar2)) {
              if (local_98._0_8_ != local_98._8_8_) {
                UnknownFieldSet::ClearFallback((UnknownFieldSet *)local_98);
              }
              _Var9._M_p = (pointer)local_98._0_8_;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_98._0_8_ ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
                return false;
              }
              goto LAB_002dcfd1;
            }
            if (local_98._0_8_ != local_98._8_8_) {
              UnknownFieldSet::ClearFallback((UnknownFieldSet *)local_98);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_98._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              operator_delete((void *)local_98._0_8_);
            }
          }
        }
      }
      lVar7 = lVar7 + 1;
      pUVar10 = (unknown_fields->fields_).
                super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar11 = lVar11 + 0x10;
    } while (lVar7 < (int)((ulong)((long)(unknown_fields->fields_).
                                         super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar10)
                          >> 4));
  }
  return true;
}

Assistant:

bool DescriptorBuilder::OptionInterpreter::ExamineIfOptionIsSet(
    std::vector<const FieldDescriptor*>::const_iterator
        intermediate_fields_iter,
    std::vector<const FieldDescriptor*>::const_iterator intermediate_fields_end,
    const FieldDescriptor* innermost_field, const std::string& debug_msg_name,
    const UnknownFieldSet& unknown_fields) {
  // We do linear searches of the UnknownFieldSet and its sub-groups.  This
  // should be fine since it's unlikely that any one options structure will
  // contain more than a handful of options.

  if (intermediate_fields_iter == intermediate_fields_end) {
    // We're at the innermost submessage.
    for (int i = 0; i < unknown_fields.field_count(); i++) {
      if (unknown_fields.field(i).number() == innermost_field->number()) {
        return AddNameError("Option \"" + debug_msg_name +
                            "\" was already set.");
      }
    }
    return true;
  }

  for (int i = 0; i < unknown_fields.field_count(); i++) {
    if (unknown_fields.field(i).number() ==
        (*intermediate_fields_iter)->number()) {
      const UnknownField* unknown_field = &unknown_fields.field(i);
      FieldDescriptor::Type type = (*intermediate_fields_iter)->type();
      // Recurse into the next submessage.
      switch (type) {
        case FieldDescriptor::TYPE_MESSAGE:
          if (unknown_field->type() == UnknownField::TYPE_LENGTH_DELIMITED) {
            UnknownFieldSet intermediate_unknown_fields;
            if (intermediate_unknown_fields.ParseFromString(
                    unknown_field->length_delimited()) &&
                !ExamineIfOptionIsSet(intermediate_fields_iter + 1,
                                      intermediate_fields_end, innermost_field,
                                      debug_msg_name,
                                      intermediate_unknown_fields)) {
              return false;  // Error already added.
            }
          }
          break;

        case FieldDescriptor::TYPE_GROUP:
          if (unknown_field->type() == UnknownField::TYPE_GROUP) {
            if (!ExamineIfOptionIsSet(intermediate_fields_iter + 1,
                                      intermediate_fields_end, innermost_field,
                                      debug_msg_name, unknown_field->group())) {
              return false;  // Error already added.
            }
          }
          break;

        default:
          GOOGLE_LOG(FATAL) << "Invalid wire type for CPPTYPE_MESSAGE: " << type;
          return false;
      }
    }
  }
  return true;
}